

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileMonitor.cxx
# Opt level: O0

void __thiscall cmRealDirectoryWatcher::~cmRealDirectoryWatcher(cmRealDirectoryWatcher *this)

{
  cmRealDirectoryWatcher *this_local;
  
  (this->super_cmVirtualDirectoryWatcher).super_cmIBaseWatcher._vptr_cmIBaseWatcher =
       (_func_int **)&PTR__cmRealDirectoryWatcher_00bbfa98;
  std::__cxx11::string::~string((string *)&this->PathSegment);
  cmVirtualDirectoryWatcher::~cmVirtualDirectoryWatcher(&this->super_cmVirtualDirectoryWatcher);
  return;
}

Assistant:

~cmRealDirectoryWatcher() override
  {
    // Handle is freed via uv_handle_close callback!
  }